

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::ForeachConstraint::fromSyntax(LoopConstraintSyntax *syntax,ASTContext *context)

{
  IteratorSymbol *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  Expression *args_2;
  iterator pLVar4;
  Scope *scope;
  ConstraintItemSyntax *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForeachConstraint *pFVar6;
  socklen_t __len;
  EVP_PKEY_CTX *src;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *args_1;
  undefined8 *in_RSI;
  ForeachConstraint *result;
  Constraint *body;
  LoopDim *dim;
  iterator __end2;
  iterator __begin2;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *__range2;
  Expression *arrayRef;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  ASTContext iterCtx;
  Compilation *comp;
  Constraint *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  BumpAllocator *this_00;
  iterator local_f8;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_d0 [2];
  sockaddr local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  Compilation *local_20;
  undefined8 *local_18;
  ForeachConstraint *local_8;
  
  local_18 = in_RSI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x6d2b74);
  local_28 = local_18[6];
  local_58._0_8_ = *local_18;
  local_58.sa_data._6_8_ = local_18[1];
  local_48 = local_18[2];
  uStack_40 = local_18[3];
  local_38 = local_18[4];
  uStack_30 = local_18[5];
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::SmallVector
            ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0x6d2bc0);
  not_null<slang::syntax::ForeachLoopListSyntax_*>::operator*
            ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0x6d2bd1);
  args_2 = ForeachLoopStatement::buildLoopDims
                     ((ForeachLoopListSyntax *)
                      dims.super_SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>.
                      firstElement._8_8_,
                      (ASTContext *)
                      dims.super_SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>.
                      firstElement._0_8_,
                      (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                      dims.super_SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>.cap);
  if (args_2 == (Expression *)0x0) {
    local_8 = (ForeachConstraint *)
              Constraint::badConstraint
                        ((Compilation *)
                         CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                         in_stack_fffffffffffffe68);
  }
  else {
    local_f8 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::begin(local_d0);
    pLVar4 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::end(local_d0);
    for (; local_f8 != pLVar4; local_f8 = local_f8 + 1) {
      if (local_f8->loopVar != (IteratorSymbol *)0x0) {
        this = local_f8->loopVar;
        scope = not_null<const_slang::ast::Scope_*>::operator*
                          ((not_null<const_slang::ast::Scope_*> *)0x6d2cf5);
        Symbol::setParent((Symbol *)this,scope);
      }
    }
    pCVar5 = not_null<slang::syntax::ConstraintItemSyntax_*>::operator*
                       ((not_null<slang::syntax::ConstraintItemSyntax_*> *)0x6d2d3b);
    iVar2 = Constraint::bind((int)pCVar5,&local_58,__len);
    this_00 = (BumpAllocator *)CONCAT44(extraout_var,iVar2);
    iVar3 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                      (local_d0,(EVP_PKEY_CTX *)local_20,src);
    pFVar6 = BumpAllocator::
             emplace<slang::ast::ForeachConstraint,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Constraint_const&>
                       (this_00,(Expression *)CONCAT44(extraout_var_00,iVar3),args_1,
                        (Constraint *)args_2);
    bVar1 = Constraint::bad((Constraint *)CONCAT44(extraout_var,iVar2));
    local_8 = pFVar6;
    if (bVar1) {
      local_8 = (ForeachConstraint *)
                Constraint::badConstraint
                          ((Compilation *)CONCAT17(bVar1,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe68);
    }
  }
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::~SmallVector
            ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0x6d2e58);
  return &local_8->super_Constraint;
}

Assistant:

Constraint& ForeachConstraint::fromSyntax(const LoopConstraintSyntax& syntax,
                                          const ASTContext& context) {
    auto& comp = context.getCompilation();

    ASTContext iterCtx = context;
    SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
    auto arrayRef = ForeachLoopStatement::buildLoopDims(*syntax.loopList, iterCtx, dims);
    if (!arrayRef)
        return badConstraint(comp, nullptr);

    // Set the parent pointer on the iterator variables in case
    // someone inspects them later. We just created these in the
    // method above so the const_cast is safe.
    for (auto& dim : dims) {
        if (dim.loopVar)
            const_cast<IteratorSymbol*>(dim.loopVar)->setParent(*context.scope);
    }

    auto& body = Constraint::bind(*syntax.constraints, iterCtx);
    auto result = comp.emplace<ForeachConstraint>(*arrayRef, dims.copy(comp), body);
    if (body.bad())
        return badConstraint(comp, result);

    return *result;
}